

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

bool __thiscall google::protobuf::FieldDescriptorProto::IsInitialized(FieldDescriptorProto *this)

{
  FieldOptions *pFVar1;
  bool bVar2;
  
  if (((this->_has_bits_).has_bits_[0] & 0x20) == 0) {
LAB_002f3f17:
    bVar2 = true;
  }
  else {
    pFVar1 = this->options_;
    bVar2 = internal::ExtensionSet::IsInitialized(&pFVar1->_extensions_);
    if (bVar2) {
      bVar2 = internal::
              AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>>
                        (&pFVar1->uninterpreted_option_);
      if (bVar2) goto LAB_002f3f17;
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

void MethodOptions::CopyFrom(const ::PROTOBUF_NAMESPACE_ID::Message& from) {
// @@protoc_insertion_point(generalized_copy_from_start:google.protobuf.MethodOptions)
  if (&from == this) return;
  Clear();
  MergeFrom(from);
}